

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue_examples.cpp
# Opt level: O1

void density_tests::heterogeneous_queue_reentrant_put_transaction_samples(void)

{
  ControlBlock *pCVar1;
  int *piVar2;
  Msg *pMVar3;
  ostream *poVar4;
  runtime_type<> *prVar5;
  type_info *ptVar6;
  size_t sVar7;
  double *pdVar8;
  size_t sVar9;
  size_t i_len;
  size_t i_len_00;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *phVar10;
  char *pcVar11;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *phVar12;
  uchar *data;
  long lVar13;
  bool bVar14;
  reentrant_put_transaction<int> transaction1;
  reentrant_put_transaction<void> transaction;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_2;
  reentrant_put_transaction<void> transaction2_1;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_1;
  int value;
  reentrant_put_transaction<int> local_100;
  undefined1 local_e8 [16];
  Value VStack_d8;
  reentrant_put_transaction<int> local_c8;
  reentrant_put_transaction<int> local_b0;
  reentrant_put_transaction<int> local_98;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> local_80;
  undefined4 local_6c;
  reentrant_put_transaction<int> local_68;
  const_iterator local_50;
  
  local_e8._0_8_ =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)local_e8);
  local_c8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_c8.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  join_0x00000010_0x00000000_ =
       density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
       inplace_allocate<1ul,true,4ul,4ul>
                 ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
                  &local_c8);
  local_e8._8_8_[1].m_next =
       (uintptr_t)
       density::detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
       ::s_table;
  *(undefined4 *)local_e8._16_8_ = 1;
  local_e8._0_8_ =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_b0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)&local_c8
  ;
  local_b0.m_put_data = join_0x00000010_0x00000000_;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)local_e8);
  local_98.m_queue = local_b0.m_queue;
  local_b0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_98.m_put_data = local_b0.m_put_data;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_b0);
  local_100.m_queue = local_98.m_queue;
  local_98.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_100.m_put_data = local_98.m_put_data;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_98);
  local_e8._0_8_ = local_100.m_queue;
  stack0xffffffffffffff20 = local_100.m_put_data;
  local_100.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  piVar2 = (int *)density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  reentrant_put_transaction<int>::element_ptr
                            ((reentrant_put_transaction<int> *)local_e8);
  if (*piVar2 != 1) {
    __assert_fail("transaction2.element() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x341,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::commit((reentrant_put_transaction<int> *)local_e8);
  if ((reentrant_put_transaction<int> *)local_e8._0_8_ != (reentrant_put_transaction<int> *)0x0) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x345,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)local_e8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_100);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c8);
  local_80.m_head = (ControlBlock *)&DAT_0000ffef;
  local_80.m_tail = (ControlBlock *)&DAT_0000ffef;
  join_0x00000010_0x00000000_ =
       density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
       inplace_allocate<1ul,true,4ul,4ul>
                 ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
                  &local_80);
  local_e8._8_8_[1].m_next =
       (uintptr_t)
       density::detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
       ::s_table;
  *(undefined4 *)local_e8._16_8_ = 1;
  local_e8._0_8_ =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_b0.m_queue = &local_80;
  local_b0.m_put_data = join_0x00000010_0x00000000_;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)local_e8);
  local_98.m_queue = local_b0.m_queue;
  local_b0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_98.m_put_data = local_b0.m_put_data;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_b0);
  local_100.m_queue = local_98.m_queue;
  local_98.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_100.m_put_data = local_98.m_put_data;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_98);
  local_98.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  join_0x00000010_0x00000000_ =
       density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
       inplace_allocate<1ul,true,4ul,4ul>
                 ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
                  &local_80);
  local_e8._8_8_[1].m_next =
       (uintptr_t)
       density::detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
       ::s_table;
  *(undefined4 *)local_e8._16_8_ = 1;
  local_e8._0_8_ =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_b0.m_queue = &local_80;
  local_b0.m_put_data = join_0x00000010_0x00000000_;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)local_e8);
  local_c8.m_queue = local_b0.m_queue;
  local_b0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_c8.m_put_data = local_b0.m_put_data;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_b0);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=((reentrant_put_transaction<void> *)&local_98,&local_c8)
  ;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_c8);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=
            ((reentrant_put_transaction<void> *)&local_98,&local_100);
  if (local_100.m_queue !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    __assert_fail("transaction1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x370,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::commit((reentrant_put_transaction<void> *)&local_98);
  if (local_98.m_queue !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x372,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)&local_98);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_100);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_80);
  local_b0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_b0.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_100.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)&local_b0
  ;
  std::chrono::_V2::system_clock::now();
  local_98.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       CONCAT44(local_98.m_queue._4_4_,0x2a);
  local_c8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       CONCAT44(local_c8.m_queue._4_4_,0x237);
  heterogeneous_queue_reentrant_put_transaction_samples::anon_class_8_1_a8890831::operator()
            ((anon_class_8_1_a8890831 *)&local_100,&local_98,i_len);
  heterogeneous_queue_reentrant_put_transaction_samples::anon_class_8_1_a8890831::operator()
            ((anon_class_8_1_a8890831 *)&local_100,&local_c8,i_len_00);
  phVar12 = local_b0.m_queue;
joined_r0x00aa144a:
  do {
    if (phVar12 ==
        (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
        local_b0.m_put_data.m_control_block) {
      phVar12 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                0x0;
    }
    else {
      pCVar1 = phVar12->m_head;
      if (((ulong)pCVar1 & 3) != 0) {
        phVar12 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)((ulong)pCVar1 & 0xfffffffffffffff8);
        goto joined_r0x00aa144a;
      }
      phVar12->m_head = (ControlBlock *)((ulong)pCVar1 | 1);
    }
    local_e8._8_8_ = phVar12;
    local_e8._0_8_ = &local_b0;
    if (phVar12 !=
        (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      reentrant_consume_operation::
      element<density_tests::heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
                ((reentrant_consume_operation *)local_e8);
      pMVar3 = density::
               heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
               reentrant_consume_operation::
               element<density_tests::heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
                         ((reentrant_consume_operation *)local_e8);
      if (pMVar3->m_len != 0) {
        sVar9 = 0;
        do {
          sVar9 = sVar9 + 1;
        } while (pMVar3->m_len != sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Message with checksum ",0x16);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," at ",4);
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      reentrant_consume_operation::
      element<density_tests::heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
                ((reentrant_consume_operation *)local_e8);
      poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_consume_operation::commit((reentrant_consume_operation *)local_e8);
    }
    if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
        local_e8._8_8_ !=
        (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      cancel_consume_impl((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           *)local_e8._0_8_,(ControlBlock *)local_e8._8_8_);
    }
    bVar14 = phVar12 !=
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0
    ;
    phVar12 = local_b0.m_queue;
  } while (bVar14);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_b0);
  local_e8._0_8_ = &DAT_0000ffef;
  local_e8._8_8_ = &DAT_0000ffef;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_e8);
  local_e8._0_8_ = &DAT_0000ffef;
  local_e8._8_8_ = (ControlBlock *)&DAT_0000ffef;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_e8);
  local_c8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_c8.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_100.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  join_0x00000010_0x00000000_ =
       density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
       inplace_allocate<1ul,true,4ul,4ul>
                 ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
                  &local_c8);
  local_e8._8_8_[1].m_next =
       (uintptr_t)
       density::detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
       ::s_table;
  *(undefined4 *)local_e8._16_8_ = 1;
  local_e8._0_8_ =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_b0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)&local_c8
  ;
  local_b0.m_put_data = join_0x00000010_0x00000000_;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)local_e8);
  local_98.m_queue = local_b0.m_queue;
  local_b0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_98.m_put_data = local_b0.m_put_data;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_b0);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=
            ((reentrant_put_transaction<void> *)&local_100,&local_98);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_98);
  if (local_100.m_queue ==
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    __assert_fail("!transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x3e9,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)&local_100);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c8);
  local_c8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_c8.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_100.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  join_0x00000010_0x00000000_ =
       density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
       inplace_allocate<1ul,true,4ul,4ul>
                 ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
                  &local_c8);
  local_e8._8_8_[1].m_next =
       (uintptr_t)
       density::detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
       ::s_table;
  *(undefined4 *)local_e8._16_8_ = 1;
  local_e8._0_8_ =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_b0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)&local_c8
  ;
  local_b0.m_put_data = join_0x00000010_0x00000000_;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)local_e8);
  local_98.m_queue = local_b0.m_queue;
  local_b0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_98.m_put_data = local_b0.m_put_data;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_b0);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=
            ((reentrant_put_transaction<void> *)&local_100,&local_98);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_98);
  if (local_100.m_queue ==
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    __assert_fail("transaction",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x3f3,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)&local_100);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c8);
  local_c8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_c8.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_100.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  join_0x00000010_0x00000000_ =
       density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
       inplace_allocate<1ul,true,4ul,4ul>
                 ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
                  &local_c8);
  local_e8._8_8_[1].m_next =
       (uintptr_t)
       density::detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
       ::s_table;
  *(undefined4 *)local_e8._16_8_ = 1;
  local_e8._0_8_ =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_b0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)&local_c8
  ;
  local_b0.m_put_data = join_0x00000010_0x00000000_;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)local_e8);
  local_98.m_queue = local_b0.m_queue;
  local_b0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_98.m_put_data = local_b0.m_put_data;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_b0);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=
            ((reentrant_put_transaction<void> *)&local_100,&local_98);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_98);
  if ((reentrant_put_transaction<int> *)local_100.m_queue != &local_c8) {
    __assert_fail("transaction.queue() == &queue",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x3fd,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)&local_100);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c8);
  local_c8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &DAT_0000ffef;
  local_c8.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  join_0x00000010_0x00000000_ =
       density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
       inplace_allocate<1ul,true,4ul,4ul>
                 ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
                  &local_c8);
  local_e8._8_8_[1].m_next =
       (uintptr_t)
       density::detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
       ::s_table;
  *(undefined4 *)local_e8._16_8_ = 0x2a;
  local_e8._0_8_ =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_b0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)&local_c8
  ;
  local_b0.m_put_data = join_0x00000010_0x00000000_;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)local_e8);
  local_98.m_queue = local_b0.m_queue;
  local_b0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_98.m_put_data = local_b0.m_put_data;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_b0);
  local_100.m_queue = local_98.m_queue;
  local_98.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_100.m_put_data = local_98.m_put_data;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_98);
  if ((reentrant_put_transaction<int> *)local_100.m_queue == (reentrant_put_transaction<int> *)0x0)
  {
    __assert_fail("!put.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x409,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::cancel(&local_100);
  phVar12 = local_c8.m_queue;
  do {
    phVar10 = phVar12;
    if (phVar10 ==
        (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
        local_c8.m_put_data.m_control_block) goto LAB_00aa1876;
    phVar12 = (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              ((ulong)phVar10->m_head & 0xfffffffffffffff8);
  } while (((ulong)phVar10->m_head & 3) != 0);
  if (phVar10 ==
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
      local_c8.m_put_data.m_control_block) {
LAB_00aa1876:
    if ((reentrant_put_transaction<int> *)local_100.m_queue == (reentrant_put_transaction<int> *)0x0
       ) {
      join_0x00000010_0x00000000_ =
           density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
           inplace_allocate<1ul,true,4ul,4ul>
                     ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                       *)&local_c8);
      local_e8._8_8_[1].m_next =
           (uintptr_t)
           density::detail::
           FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
           ::s_table;
      *(undefined4 *)local_e8._16_8_ = 0x2a;
      local_e8._0_8_ =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
      local_b0.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           &local_c8;
      local_b0.m_put_data = join_0x00000010_0x00000000_;
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_put_transaction<int>::~reentrant_put_transaction
                ((reentrant_put_transaction<int> *)local_e8);
      local_98.m_queue = local_b0.m_queue;
      local_b0.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
      local_98.m_put_data = local_b0.m_put_data;
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_put_transaction<int>::~reentrant_put_transaction(&local_b0);
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      reentrant_put_transaction<int>::operator=
                ((reentrant_put_transaction<int> *)&local_100,&local_98);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_put_transaction<int>::~reentrant_put_transaction(&local_98);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_put_transaction<int>::commit(&local_100);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      cbegin(&local_50,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c8);
      local_e8._0_8_ = local_50.m_control;
      local_e8._8_8_ = local_50.m_queue;
      if ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
          local_50.m_control !=
          (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
        lVar13 = 1;
        do {
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::const_iterator::operator++((const_iterator *)local_e8);
          lVar13 = lVar13 + -1;
        } while ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )local_e8._0_8_ !=
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )0x0);
        if (lVar13 == 0) {
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_100);
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_c8);
          local_80.m_head = (ControlBlock *)&DAT_0000ffef;
          local_80.m_tail = (ControlBlock *)&DAT_0000ffef;
          local_6c = 0x2a;
          local_b0.m_queue =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               density::detail::
               FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
               ::s_table;
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::start_reentrant_dyn_push_copy
                    ((reentrant_put_transaction<void> *)local_e8,&local_80,
                     (runtime_type<> *)&local_b0,&local_6c);
          local_100.m_queue =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_e8._0_8_;
          local_100.m_put_data.m_control_block = (ControlBlock *)local_e8._8_8_;
          local_100.m_put_data.m_user_storage = VStack_d8.m_pair.m_address;
          local_e8._0_8_ =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               0x0;
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<void>::~reentrant_put_transaction
                    ((reentrant_put_transaction<void> *)local_e8);
          piVar2 = (int *)density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::reentrant_put_transaction<void>::element_ptr
                                    ((reentrant_put_transaction<void> *)&local_100);
          if (*piVar2 != 0x2a) {
            __assert_fail("*static_cast<int *>(put.element_ptr()) == 42",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                          ,0x419,
                          "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()"
                         );
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Putting an ",0xb);
          prVar5 = density::
                   heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   ::reentrant_put_transaction<void>::complete_type
                             ((reentrant_put_transaction<void> *)&local_100);
          ptVar6 = density::runtime_type<>::type_info(prVar5);
          pcVar11 = *(char **)(ptVar6 + 8) + (**(char **)(ptVar6 + 8) == '*');
          sVar7 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,sVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...",3);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
          std::ostream::put('H');
          std::ostream::flush();
          join_0x00000010_0x00000000_ =
               density::
               heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
               inplace_allocate<1ul,true,4ul,4ul>
                         ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                           *)&local_80);
          local_e8._8_8_[1].m_next =
               (uintptr_t)
               density::detail::
               FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
               ::s_table;
          *(undefined4 *)local_e8._16_8_ = 1;
          local_e8._0_8_ =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               0x0;
          local_b0.m_queue = &local_80;
          local_b0.m_put_data = join_0x00000010_0x00000000_;
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<int>::~reentrant_put_transaction
                    ((reentrant_put_transaction<int> *)local_e8);
          local_c8.m_queue = local_b0.m_queue;
          local_b0.m_queue =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               0x0;
          local_c8.m_put_data = local_b0.m_put_data;
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_b0);
          local_98.m_queue = local_c8.m_queue;
          local_c8.m_queue =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               0x0;
          local_98.m_put_data = local_c8.m_put_data;
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_c8);
          piVar2 = (int *)density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::reentrant_put_transaction<int>::element_ptr(&local_98);
          if (*piVar2 != 1) {
            __assert_fail("*static_cast<int *>(put_1.element_ptr()) == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                          ,0x421,
                          "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()"
                         );
          }
          piVar2 = (int *)density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::reentrant_put_transaction<int>::element_ptr(&local_98);
          if (*piVar2 != 1) {
            __assert_fail("put_1.element() == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                          ,0x422,
                          "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()"
                         );
          }
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_98);
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<void>::~reentrant_put_transaction
                    ((reentrant_put_transaction<void> *)&local_100);
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::destroy(&local_80);
          local_100.m_queue =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &DAT_0000ffef;
          local_100.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
          local_c8.m_queue =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               CONCAT44(local_c8.m_queue._4_4_,0x2a);
          local_98.m_queue =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               density::detail::
               FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
               ::s_table;
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::start_reentrant_dyn_push_copy
                    ((reentrant_put_transaction<void> *)&local_b0,
                     (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      *)&local_100,(runtime_type<> *)&local_98,&local_c8);
          local_e8._0_8_ = local_b0.m_queue;
          stack0xffffffffffffff20 = local_b0.m_put_data;
          local_b0.m_queue =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               0x0;
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<void>::~reentrant_put_transaction
                    ((reentrant_put_transaction<void> *)&local_b0);
          prVar5 = density::
                   heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   ::reentrant_put_transaction<void>::complete_type
                             ((reentrant_put_transaction<void> *)local_e8);
          if (prVar5->m_feature_table !=
              (tuple_type *)
              density::detail::
              FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
              ::s_table) {
            __assert_fail("put.complete_type().is<int>()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                          ,0x42b,
                          "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()"
                         );
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Putting an ",0xb);
          prVar5 = density::
                   heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   ::reentrant_put_transaction<void>::complete_type
                             ((reentrant_put_transaction<void> *)local_e8);
          ptVar6 = density::runtime_type<>::type_info(prVar5);
          pcVar11 = *(char **)(ptVar6 + 8) + (**(char **)(ptVar6 + 8) == '*');
          sVar7 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,sVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...",3);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
          std::ostream::put('H');
          std::ostream::flush();
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<void>::~reentrant_put_transaction
                    ((reentrant_put_transaction<void> *)local_e8);
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_100);
          local_100.m_queue =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &DAT_0000ffef;
          local_100.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
          join_0x00000010_0x00000000_ =
               density::
               heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
               inplace_allocate<1ul,true,4ul,4ul>
                         ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                           *)&local_100);
          local_e8._8_8_[1].m_next =
               (uintptr_t)
               density::detail::
               FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
               ::s_table;
          *(undefined4 *)local_e8._16_8_ = 0x2a;
          local_e8._0_8_ =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               0x0;
          local_b0.m_queue =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &local_100;
          local_b0.m_put_data = join_0x00000010_0x00000000_;
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<int>::~reentrant_put_transaction
                    ((reentrant_put_transaction<int> *)local_e8);
          local_68.m_queue = local_b0.m_queue;
          local_b0.m_queue =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               0x0;
          local_68.m_put_data = local_b0.m_put_data;
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_b0);
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_68);
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_100);
          local_80.m_head = (ControlBlock *)&DAT_0000ffef;
          local_80.m_tail = (ControlBlock *)&DAT_0000ffef;
          local_6c = 0x2a;
          local_b0.m_queue =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               density::detail::
               FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
               ::s_table;
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::start_reentrant_dyn_push_copy
                    ((reentrant_put_transaction<void> *)local_e8,&local_80,
                     (runtime_type<> *)&local_b0,&local_6c);
          local_100.m_queue =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_e8._0_8_;
          local_100.m_put_data.m_control_block = (ControlBlock *)local_e8._8_8_;
          local_100.m_put_data.m_user_storage = VStack_d8.m_pair.m_address;
          local_e8._0_8_ =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               0x0;
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<void>::~reentrant_put_transaction
                    ((reentrant_put_transaction<void> *)local_e8);
          join_0x00000010_0x00000000_ =
               density::
               heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
               inplace_allocate<1ul,true,8ul,8ul>
                         ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                           *)&local_80);
          local_e8._8_8_[1].m_next =
               (uintptr_t)
               density::detail::
               FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,double>
               ::s_table;
          *(undefined8 *)local_e8._16_8_ = 0x4045000000000000;
          local_e8._0_8_ =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               0x0;
          local_b0.m_queue = &local_80;
          local_b0.m_put_data = join_0x00000010_0x00000000_;
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<double>::~reentrant_put_transaction
                    ((reentrant_put_transaction<double> *)local_e8);
          local_c8.m_queue = local_b0.m_queue;
          local_b0.m_queue =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               0x0;
          local_c8.m_put_data = local_b0.m_put_data;
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<double>::~reentrant_put_transaction
                    ((reentrant_put_transaction<double> *)&local_b0);
          local_98.m_queue = local_c8.m_queue;
          local_c8.m_queue =
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               0x0;
          local_98.m_put_data = local_c8.m_put_data;
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<double>::~reentrant_put_transaction
                    ((reentrant_put_transaction<double> *)&local_c8);
          pdVar8 = (double *)
                   density::
                   heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   ::reentrant_put_transaction<double>::element_ptr
                             ((reentrant_put_transaction<double> *)&local_98);
          if ((*pdVar8 == 42.0) && (!NAN(*pdVar8))) {
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_put_transaction<double>::~reentrant_put_transaction
                      ((reentrant_put_transaction<double> *)&local_98);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_put_transaction<void>::~reentrant_put_transaction
                      ((reentrant_put_transaction<void> *)&local_100);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            destroy(&local_80);
            return;
          }
          __assert_fail("typed_put.element() == 42.",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                        ,0x445,
                        "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()"
                       );
        }
      }
      __assert_fail("std::distance(queue.cbegin(), queue.cend()) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x410,
                    "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
    }
  }
  __assert_fail("queue.empty() && put.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                ,0x40b,"void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()"
               );
}

Assistant:

void heterogeneous_queue_reentrant_put_transaction_samples()
    {
        using namespace density;
        {
            //! [heter_queue reentrant_put_transaction default_construct example 1]
            heter_queue<>::reentrant_put_transaction<> transaction;
            assert(transaction.empty());
            //! [heter_queue reentrant_put_transaction default_construct example 1]
        }
        {
            //! [heter_queue reentrant_put_transaction copy_construct example 1]
            static_assert(
              !std::is_copy_constructible<heter_queue<>::reentrant_put_transaction<>>::value, "");
            static_assert(
              !std::is_copy_constructible<heter_queue<int>::reentrant_put_transaction<>>::value,
              "");
            //! [heter_queue reentrant_put_transaction copy_construct example 1]
        }
        {
            //! [heter_queue reentrant_put_transaction copy_assign example 1]
            static_assert(
              !std::is_copy_assignable<heter_queue<>::reentrant_put_transaction<>>::value, "");
            static_assert(
              !std::is_copy_assignable<heter_queue<int>::reentrant_put_transaction<>>::value, "");
            //! [heter_queue reentrant_put_transaction copy_assign example 1]
        }
        {
            //! [heter_queue reentrant_put_transaction move_construct example 1]
            heter_queue<> queue;
            auto          transaction1 = queue.start_reentrant_push(1);

            // move from transaction1 to transaction2
            auto transaction2(std::move(transaction1));
            assert(transaction1.empty());
            assert(transaction2.element() == 1);

            // commit transaction2
            transaction2.commit();
            assert(transaction2.empty());

            //! [heter_queue reentrant_put_transaction move_construct example 1]

            //! [heter_queue reentrant_put_transaction move_construct example 2]
            // reentrant_put_transaction<void> can be move constructed from any reentrant_put_transaction<T>
            static_assert(
              std::is_constructible<
                heter_queue<>::reentrant_put_transaction<void>,
                heter_queue<>::reentrant_put_transaction<void> &&>::value,
              "");
            static_assert(
              std::is_constructible<
                heter_queue<>::reentrant_put_transaction<void>,
                heter_queue<>::reentrant_put_transaction<int> &&>::value,
              "");

            // reentrant_put_transaction<T> can be move constructed only from reentrant_put_transaction<T>
            static_assert(
              !std::is_constructible<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<void> &&>::value,
              "");
            static_assert(
              !std::is_constructible<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<float> &&>::value,
              "");
            static_assert(
              std::is_constructible<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<int> &&>::value,
              "");
            //! [heter_queue reentrant_put_transaction move_construct example 2]
        }
        {
            //! [heter_queue reentrant_put_transaction move_assign example 1]
            heter_queue<> queue;
            auto          transaction1 = queue.start_reentrant_push(1);

            heter_queue<>::reentrant_put_transaction<> transaction2;
            transaction2 = queue.start_reentrant_push(1);
            transaction2 = std::move(transaction1);
            assert(transaction1.empty());
            transaction2.commit();
            assert(transaction2.empty());
            //! [heter_queue reentrant_put_transaction move_assign example 1]

            //! [heter_queue reentrant_put_transaction move_assign example 2]
            // reentrant_put_transaction<void> can be move assigned from any reentrant_put_transaction<T>
            static_assert(
              std::is_assignable<
                heter_queue<>::reentrant_put_transaction<void>,
                heter_queue<>::reentrant_put_transaction<void> &&>::value,
              "");
            static_assert(
              std::is_assignable<
                heter_queue<>::reentrant_put_transaction<void>,
                heter_queue<>::reentrant_put_transaction<int> &&>::value,
              "");

            // reentrant_put_transaction<T> can be move assigned only from reentrant_put_transaction<T>
            static_assert(
              !std::is_assignable<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<void> &&>::value,
              "");
            static_assert(
              !std::is_assignable<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<float> &&>::value,
              "");
            static_assert(
              std::is_assignable<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<int> &&>::value,
              "");
            //! [heter_queue reentrant_put_transaction move_assign example 2]
        }
        {
            //! [heter_queue reentrant_put_transaction raw_allocate example 1]
            heter_queue<> queue;
            struct Msg
            {
                std::chrono::high_resolution_clock::time_point m_time =
                  std::chrono::high_resolution_clock::now();
                size_t m_len  = 0;
                void * m_data = nullptr;
            };

            auto post_message = [&queue](const void * i_data, size_t i_len) {
                auto transaction             = queue.start_reentrant_emplace<Msg>();
                transaction.element().m_len  = i_len;
                transaction.element().m_data = transaction.raw_allocate(i_len, 1);
                memcpy(transaction.element().m_data, i_data, i_len);

                assert(
                  !transaction
                     .empty()); // a put transaction is not empty if it's bound to an element being put
                transaction.commit();
                assert(transaction.empty()); // the commit makes the transaction empty
            };

            auto const start_time = std::chrono::high_resolution_clock::now();

            auto consume_all_msgs = [&queue, &start_time] {
                while (auto consume = queue.try_start_reentrant_consume())
                {
                    auto const checksum =
                      compute_checksum(consume.element<Msg>().m_data, consume.element<Msg>().m_len);
                    std::cout << "Message with checksum " << checksum << " at ";
                    std::cout << (consume.element<Msg>().m_time - start_time).count() << std::endl;
                    consume.commit();
                }
            };

            int msg_1 = 42, msg_2 = 567;
            post_message(&msg_1, sizeof(msg_1));
            post_message(&msg_2, sizeof(msg_2));

            consume_all_msgs();
            //! [heter_queue reentrant_put_transaction raw_allocate example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction raw_allocate_copy example 1]
            struct Msg
            {
                size_t m_len   = 0;
                char * m_chars = nullptr;
            };
            auto post_message = [&queue](const char * i_data, size_t i_len) {
                auto transaction            = queue.start_reentrant_emplace<Msg>();
                transaction.element().m_len = i_len;
                transaction.element().m_chars =
                  transaction.raw_allocate_copy(i_data, i_data + i_len);
                memcpy(transaction.element().m_chars, i_data, i_len);
                transaction.commit();
            };
            //! [heter_queue reentrant_put_transaction raw_allocate_copy example 1]
            (void)post_message;
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction raw_allocate_copy example 2]
            struct Msg
            {
                char * m_chars = nullptr;
            };
            auto post_message = [&queue](const std::string & i_string) {
                auto transaction              = queue.start_reentrant_emplace<Msg>();
                transaction.element().m_chars = transaction.raw_allocate_copy(i_string);
                transaction.commit();
            };
            //! [heter_queue reentrant_put_transaction raw_allocate_copy example 2]
            (void)post_message;
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction empty example 1]
            heter_queue<>::reentrant_put_transaction<> transaction;
            assert(transaction.empty());

            transaction = queue.start_reentrant_push(1);
            assert(!transaction.empty());
            //! [heter_queue reentrant_put_transaction empty example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction operator_bool example 1]
            heter_queue<>::reentrant_put_transaction<> transaction;
            assert(!transaction);

            transaction = queue.start_reentrant_push(1);
            assert(transaction);
            //! [heter_queue reentrant_put_transaction operator_bool example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction queue example 1]
            heter_queue<>::reentrant_put_transaction<> transaction;
            assert(transaction.queue() == nullptr);

            transaction = queue.start_reentrant_push(1);
            assert(transaction.queue() == &queue);
            //! [heter_queue reentrant_put_transaction queue example 1]
        }
        {
            //! [heter_queue reentrant_put_transaction cancel example 1]
            heter_queue<> queue;

            // start and cancel a put
            assert(queue.empty());
            auto put = queue.start_reentrant_push(42);
            /* assert(queue.empty()); <- this assert would trigger an undefined behavior, because it would access
        the queue during a non-reentrant put transaction. */
            assert(!put.empty());
            put.cancel();
            assert(queue.empty() && put.empty());

            // start and commit a put
            put = queue.start_reentrant_push(42);
            put.commit();
            assert(std::distance(queue.cbegin(), queue.cend()) == 1);
            //! [heter_queue reentrant_put_transaction cancel example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction element_ptr example 1]
            int  value = 42;
            auto put =
              queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
            assert(*static_cast<int *>(put.element_ptr()) == 42);
            std::cout << "Putting an " << put.complete_type().type_info().name() << "..."
                      << std::endl;

            //! [heter_queue reentrant_put_transaction element_ptr example 1]

            //! [heter_queue reentrant_put_transaction element_ptr example 2]
            auto put_1 = queue.start_reentrant_push(1);
            assert(*static_cast<int *>(put_1.element_ptr()) == 1); // this is fine
            assert(put_1.element() == 1);                          // this is better
            //! [heter_queue reentrant_put_transaction element_ptr example 2]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction complete_type example 1]
            int  value = 42;
            auto put =
              queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
            assert(put.complete_type().is<int>());
            std::cout << "Putting an " << put.complete_type().type_info().name() << "..."
                      << std::endl;
            //! [heter_queue reentrant_put_transaction complete_type example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction destroy example 1]
            queue.start_reentrant_push(
              42); /* this transaction is destroyed without being committed,
                            so it gets canceled automatically. */
            //! [heter_queue reentrant_put_transaction destroy example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_typed_put_transaction element example 1]

            int  value = 42;
            auto untyped_put =
              queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);

            auto typed_put = queue.start_reentrant_push(42.);

            /* typed_put = std::move(untyped_put); <- this would not compile: can't assign an untyped
        transaction to a typed transaction */

            assert(typed_put.element() == 42.);

            //! [heter_queue reentrant_typed_put_transaction element example 1]
        }
    }